

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenStructMutator
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
  bVar1 = IsScalar((field->value).type.base_type);
  if (bVar1) {
    if ((struct_def->fixed & 1U) == 0) {
      MutateScalarFieldOfTable(this,struct_def,field,code_ptr);
    }
    else {
      MutateScalarFieldOfStruct(this,struct_def,field,code_ptr);
    }
  }
  else {
    bVar1 = IsVector(&(field->value).type);
    if ((bVar1) && (bVar1 = IsScalar((field->value).type.element), bVar1)) {
      MutateElementOfVectorOfNonStruct(this,struct_def,field,code_ptr);
    }
  }
  return;
}

Assistant:

void GenStructMutator(const StructDef &struct_def, const FieldDef &field,
                        std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, "");
    if (IsScalar(field.value.type.base_type)) {
      if (struct_def.fixed) {
        MutateScalarFieldOfStruct(struct_def, field, code_ptr);
      } else {
        MutateScalarFieldOfTable(struct_def, field, code_ptr);
      }
    } else if (IsVector(field.value.type)) {
      if (IsScalar(field.value.type.element)) {
        MutateElementOfVectorOfNonStruct(struct_def, field, code_ptr);
      }
    }
  }